

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void plot_getrect(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                 t_float basey,int *xp1,int *yp1,int *xp2,int *yp2)

{
  t_gobj *x;
  int iVar1;
  int iVar2;
  _parentwidgetbehavior *p_Var3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  _gobj **pp_Var10;
  t_float tVar11;
  t_float local_14c;
  int yy2;
  int yy1;
  int xx2;
  int xx1;
  t_float wpix;
  t_float ypix;
  t_float xpix;
  t_float scalarvis;
  t_float vis;
  t_float yloc;
  t_float xinc;
  t_float xloc;
  int xonset;
  int wonset;
  int yonset;
  int elemsize;
  double local_f0;
  _fielddesc *local_e8;
  ulong local_e0;
  ulong local_d8;
  _fielddesc *local_d0;
  _glist *local_c8;
  double local_c0;
  double local_b8;
  int *local_b0;
  int *local_a8;
  _gobj **local_a0;
  long local_98;
  ulong local_90;
  _fielddesc *local_88;
  t_template *local_80;
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  _array *array;
  t_symbol *elemtemplatesym;
  t_template *elemtemplate;
  _glist *elemtemplatecanvas;
  t_float edit;
  t_float style;
  t_float linewidth;
  
  if ((glist->gl_list == (t_gobj *)0x0) || (glist->gl_list->g_next != (_gobj *)0x0)) {
    local_c8 = glist;
    local_b0 = xp1;
    local_a8 = yp1;
    iVar1 = plot_readownertemplate
                      ((t_plot *)z,data,template,&elemtemplatesym,&array,&linewidth,&xloc,&xinc,
                       &yloc,&style,&vis,&scalarvis,&edit,&xfielddesc,&yfielddesc,&wfielddesc);
    iVar7 = -0x7fffffff;
    iVar9 = 0x7fffffff;
    if ((iVar1 == 0) && ((vis != 0.0 || (NAN(vis))))) {
      iVar2 = array_getfields(elemtemplatesym,&elemtemplatecanvas,&elemtemplate,&elemsize,xfielddesc
                              ,yfielddesc,wfielddesc,&xonset,&yonset,&wonset);
      iVar1 = -0x7fffffff;
      iVar6 = 0x7fffffff;
      if (iVar2 == 0) {
        uVar4 = array->a_n;
        lVar8 = 0;
        local_90 = 1;
        if (2000 < (int)uVar4) {
          local_90 = (ulong)uVar4 / 1000;
        }
        local_98 = (long)elemsize;
        local_d8 = (ulong)(uint)xonset;
        local_e0 = (ulong)(uint)yonset;
        local_b8 = (double)basex;
        local_c0 = (double)xinc;
        local_a0 = &elemtemplatecanvas->gl_list;
        local_80 = elemtemplate;
        local_f0 = 0.0;
        iVar7 = -0x7fffffff;
        iVar9 = 0x7fffffff;
        iVar1 = -0x7fffffff;
        local_e8 = xfielddesc;
        local_d0 = yfielddesc;
        local_88 = wfielddesc;
        for (; lVar8 < (int)uVar4; lVar8 = lVar8 + local_90) {
          lVar5 = lVar8 * local_98;
          array_getcoordinate(local_c8,array->a_vec + lVar5,(int)local_d8,(int)local_e0,wonset,
                              (int)lVar8,basex + xloc,basey + yloc,xinc,local_e8,local_d0,local_88,
                              &xpix,&ypix,&wpix);
          if (xpix < (float)iVar6) {
            iVar6 = (int)xpix;
          }
          if ((float)iVar7 < xpix) {
            iVar7 = (int)xpix;
          }
          iVar2 = (int)(ypix - wpix);
          if ((float)iVar9 <= ypix - wpix) {
            iVar2 = iVar9;
          }
          iVar9 = (int)(ypix + wpix);
          if (ypix + wpix <= (float)iVar1) {
            iVar9 = iVar1;
          }
          iVar1 = iVar9;
          if ((scalarvis != 0.0) || (iVar9 = iVar2, NAN(scalarvis))) {
            if ((int)local_d8 < 0) {
              local_14c = (t_float)(local_f0 + local_b8);
              local_f0 = local_f0 + local_c0;
            }
            else {
              tVar11 = fielddesc_cvttocoord(local_e8,*(t_float *)(array->a_vec + local_d8 + lVar5));
              local_14c = tVar11 + basex + xloc;
            }
            if ((int)local_e0 < 0) {
              tVar11 = 0.0;
            }
            else {
              tVar11 = *(t_float *)(array->a_vec + local_e0 + lVar5);
            }
            tVar11 = fielddesc_cvttocoord(local_d0,tVar11);
            pp_Var10 = local_a0;
            while (x = *pp_Var10, iVar9 = iVar2, x != (t_gobj *)0x0) {
              p_Var3 = pd_getparentwidget(&x->g_pd);
              if (p_Var3 != (_parentwidgetbehavior *)0x0) {
                (*p_Var3->w_parentgetrectfn)
                          (x,local_c8,(t_word *)(array->a_vec + lVar5),local_80,local_14c,
                           tVar11 + basey + yloc,&xx1,&yy1,&xx2,&yy2);
                if (xx1 < iVar6) {
                  iVar6 = xx1;
                }
                if (yy1 < iVar2) {
                  iVar2 = yy1;
                }
                if (iVar7 < xx2) {
                  iVar7 = xx2;
                }
                if (iVar1 < yy2) {
                  iVar1 = yy2;
                }
              }
              pp_Var10 = &x->g_next;
            }
          }
          uVar4 = array->a_n;
        }
      }
    }
    else {
      iVar1 = -0x7fffffff;
      iVar6 = 0x7fffffff;
    }
    *local_b0 = iVar6;
    *local_a8 = iVar9;
    *xp2 = iVar7;
    *yp2 = iVar1;
  }
  else {
    *yp1 = -0x7fffffff;
    *xp1 = -0x7fffffff;
    *yp2 = 0x7fffffff;
    *xp2 = 0x7fffffff;
  }
  return;
}

Assistant:

static void plot_getrect(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_plot *x = (t_plot *)z;
    int elemsize, yonset, wonset, xonset;
    t_canvas *elemtemplatecanvas;
    t_template *elemtemplate;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, yval, vis, scalarvis, edit;
    double xsum;
    t_array *array;
    int x1 = 0x7fffffff, y1 = 0x7fffffff, x2 = -0x7fffffff, y2 = -0x7fffffff;
    int i;
    t_float xpix, ypix, wpix;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;
        /* if we're the only plot in the glist claim the whole thing */
    if (glist->gl_list && !glist->gl_list->g_next)
    {
        *xp1 = *yp1 = -0x7fffffff;
        *xp2 = *yp2 = 0x7fffffff;
        return;
    }
    if (!plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
            &vis, &scalarvis, &edit, &xfielddesc, &yfielddesc, &wfielddesc) &&
                (vis != 0) &&
            !array_getfields(elemtemplatesym, &elemtemplatecanvas,
                &elemtemplate, &elemsize,
                xfielddesc, yfielddesc, wfielddesc,
                &xonset, &yonset, &wonset))
    {
            /* if it has more than 2000 points, just check 1000 of them. */
        int incr = (array->a_n <= 2000 ? 1 : array->a_n / 1000);
        for (i = 0, xsum = 0; i < array->a_n; i += incr)
        {
            t_float usexloc, useyloc;
            t_gobj *y;
                /* get the coords of the point proper */
            array_getcoordinate(glist, (char *)(array->a_vec) + i * elemsize,
                xonset, yonset, wonset, i, basex + xloc, basey + yloc, xinc,
                xfielddesc, yfielddesc, wfielddesc, &xpix, &ypix, &wpix);
            if (xpix < x1)
                x1 = xpix;
            if (xpix > x2)
                x2 = xpix;
            if (ypix - wpix < y1)
                y1 = ypix - wpix;
            if (ypix + wpix > y2)
                y2 = ypix + wpix;

            if (scalarvis != 0)
            {
                    /* check also the drawing instructions for the scalar */
                if (xonset >= 0)
                    usexloc = basex + xloc + fielddesc_cvttocoord(xfielddesc,
                        *(t_float *)(((char *)(array->a_vec) + elemsize * i)
                            + xonset));
                else usexloc = basex + xsum, xsum += xinc;
                if (yonset >= 0)
                    yval = *(t_float *)(((char *)(array->a_vec) + elemsize * i)
                        + yonset);
                else yval = 0;
                useyloc = basey + yloc + fielddesc_cvttocoord(yfielddesc, yval);
                for (y = elemtemplatecanvas->gl_list; y; y = y->g_next)
                {
                    int xx1, xx2, yy1, yy2;
                    const t_parentwidgetbehavior *wb =
                        pd_getparentwidget(&y->g_pd);
                    if (!wb) continue;
                    (*wb->w_parentgetrectfn)(y, glist,
                        (t_word *)((char *)(array->a_vec) + elemsize * i),
                            elemtemplate, usexloc, useyloc,
                                &xx1, &yy1, &xx2, &yy2);
                    if (xx1 < x1)
                        x1 = xx1;
                    if (yy1 < y1)
                        y1 = yy1;
                     if (xx2 > x2)
                        x2 = xx2;
                    if (yy2 > y2)
                        y2 = yy2;
                }
            }
        }
    }

    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}